

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whitelist_impl.h
# Opt level: O3

int secp256k1_whitelist_hash_pubkey(secp256k1_scalar *output,secp256k1_gej *pubkey)

{
  int iVar1;
  undefined4 extraout_EAX;
  undefined1 auVar2 [16];
  int overflow;
  size_t size;
  uchar c [33];
  uchar h [32];
  secp256k1_ge ge;
  int local_144;
  size_t local_140;
  uchar local_138 [48];
  secp256k1_sha256 local_108;
  uchar local_98 [40];
  secp256k1_ge local_70;
  
  local_144 = 0;
  local_140 = 0x21;
  secp256k1_ge_set_gej(&local_70,pubkey);
  local_108.s[0] = 0x6a09e667;
  local_108.s[1] = 0xbb67ae85;
  local_108.s[2] = 0x3c6ef372;
  local_108.s[3] = 0xa54ff53a;
  local_108.s[4] = 0x510e527f;
  local_108.s[5] = 0x9b05688c;
  local_108.s[6] = 0x1f83d9ab;
  local_108.s[7] = 0x5be0cd19;
  local_108.bytes = 0;
  iVar1 = secp256k1_eckey_pubkey_serialize(&local_70,local_138,&local_140,0x102);
  if (iVar1 != 0) {
    secp256k1_sha256_write(&local_108,local_138,local_140);
    secp256k1_sha256_finalize(&local_108,local_98);
    secp256k1_scalar_set_b32(output,local_98,&local_144);
    if ((local_144 == 0) &&
       (auVar2._0_4_ = -(uint)((int)output->d[2] == 0 && (int)output->d[0] == 0),
       auVar2._4_4_ = -(uint)(*(int *)((long)output->d + 0x14) == 0 &&
                             *(int *)((long)output->d + 4) == 0),
       auVar2._8_4_ = -(uint)((int)output->d[3] == 0 && (int)output->d[1] == 0),
       auVar2._12_4_ =
            -(uint)(*(int *)((long)output->d + 0x1c) == 0 && *(int *)((long)output->d + 0xc) == 0),
       iVar1 = movmskps(extraout_EAX,auVar2), iVar1 != 0xf)) {
      return 1;
    }
    output->d[2] = 0;
    output->d[3] = 0;
    output->d[0] = 0;
    output->d[1] = 0;
  }
  return 0;
}

Assistant:

static int secp256k1_whitelist_hash_pubkey(secp256k1_scalar* output, secp256k1_gej* pubkey) {
    unsigned char h[32];
    unsigned char c[33];
    secp256k1_sha256 sha;
    int overflow = 0;
    size_t size = 33;
    secp256k1_ge ge;

    secp256k1_ge_set_gej(&ge, pubkey);

    secp256k1_sha256_initialize(&sha);
    if (!secp256k1_eckey_pubkey_serialize(&ge, c, &size, SECP256K1_EC_COMPRESSED)) {
        return 0;
    }
    secp256k1_sha256_write(&sha, c, size);
    secp256k1_sha256_finalize(&sha, h);

    secp256k1_scalar_set_b32(output, h, &overflow);
    if (overflow || secp256k1_scalar_is_zero(output)) {
        /* This return path is mathematically impossible to hit */
        secp256k1_scalar_clear(output);
        return 0;
    }
    return 1;
}